

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

Vec_Vec_t *
Saig_ManCexMinCollectReason
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int fPiReason)

{
  int iVar1;
  int i;
  Vec_Vec_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  int iVar3;
  int i_00;
  
  iVar3 = pCex->iFrame + 1;
  p = Vec_VecStart(iVar3);
  p_00 = Vec_IntAlloc(iVar3);
  for (iVar3 = pCex->iFrame; -1 < iVar3; iVar3 = iVar3 + -1) {
    Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,iVar3,p_00);
    if (iVar3 == pCex->iFrame) {
      pVVar2 = (Vec_Int_t *)0x0;
    }
    else {
      pVVar2 = Vec_VecEntryInt(vFrameCis,iVar3 + 1);
    }
    Saig_ManCexMinGetCos(pAig,pCex,pVVar2,p_00);
    Aig_ManIncrementTravId(pAig);
    iVar1 = p_00->nSize;
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      i = Vec_IntEntry(p_00,i_00);
      pObj = Aig_ManObj(pAig,i);
      pVVar2 = Vec_VecEntryInt(p,iVar3);
      Saig_ManCexMinCollectReason_rec(pAig,pObj,pVVar2,fPiReason);
    }
  }
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int fPiReason )
{
    Vec_Vec_t * vFrameReas;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // select reason for the property to fail
    vFrameReas = Vec_VecStart( pCex->iFrame+1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // set phase and polarity
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectReason_rec( pAig, pObj, Vec_VecEntryInt(vFrameReas, f), fPiReason );
//printf( "%d(%d) ", Vec_VecLevelSize(vFrameCis, f), Vec_VecLevelSize(vFrameReas, f) ); 
    }
//printf( "\n" );
    Vec_IntFree( vRoots );
    return vFrameReas;
}